

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description.hpp
# Opt level: O1

void __thiscall
duckdb::TableDescription::TableDescription
          (TableDescription *this,string *database_name,string *schema_name,string *table_name)

{
  pointer pcVar1;
  
  (this->database)._M_dataplus._M_p = (pointer)&(this->database).field_2;
  pcVar1 = (database_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + database_name->_M_string_length);
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  pcVar1 = (schema_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->schema,pcVar1,pcVar1 + schema_name->_M_string_length);
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  pcVar1 = (table_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->table,pcVar1,pcVar1 + table_name->_M_string_length);
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TableDescription(const string &database_name, const string &schema_name, const string &table_name)
	    : database(database_name), schema(schema_name), table(table_name) {}